

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O2

avl_node * avl_prev(avl_node *node)

{
  avl_node *paVar1;
  avl_node *paVar2;
  avl_node *paVar3;
  
  if (node == (avl_node *)0x0) {
    return (avl_node *)0x0;
  }
  paVar2 = node->left;
  paVar1 = node;
  if (node->left == (avl_node *)0x0) {
    paVar2 = (avl_node *)((ulong)node->parent & 0xfffffffffffffffc);
    if (paVar2 == (avl_node *)0x0) {
      return (avl_node *)0x0;
    }
    paVar1 = (avl_node *)0x0;
    while (paVar3 = paVar2, paVar3 != (avl_node *)0x0) {
      if (paVar3->right == node) {
        return paVar3;
      }
      node = paVar3;
      paVar2 = (avl_node *)((ulong)paVar3->parent & 0xfffffffffffffffc);
    }
  }
  else {
    while (paVar3 = paVar2, paVar3 != (avl_node *)0x0) {
      paVar1 = paVar3;
      paVar2 = paVar3->right;
    }
  }
  return paVar1;
}

Assistant:

struct avl_node* avl_prev(struct avl_node *node)
{
    if (node == NULL) return NULL;

#ifdef _AVL_NEXT_POINTER
    return node->prev;
#else

    struct avl_node *p;

    // largest value of left subtree
    if (node->left) {
        p = node;
        node = node->left;
        while (node) {
            p = node;
            node = node->right;
        }
        return p;
    }

    // node does not have left child
    if (avl_parent(node)) {
        // find first parent that has left child
        p = node;
        node = avl_parent(node);
        while(node) {
            if (node->right == p) {
                return node;
            }
            p = node;
            node = avl_parent(node);
        }
    }
#endif
    return NULL;
}